

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::Array<char>_> *
kj::parse::Many_<kj::parse::CharGroup_,_false>::Impl<capnp::compiler::Lexer::ParserInput,_char>::
apply(Maybe<kj::Array<char>_> *__return_storage_ptr__,CharGroup_ *subParser,ParserInput *input)

{
  ArrayDisposer *pAVar1;
  ArrayDisposer *pAVar2;
  char cVar3;
  Maybe<kj::Array<char>_> *pMVar4;
  NullableValue<char> subResult;
  ParserInput subInput;
  Results results;
  undefined1 local_8c [4];
  IteratorInput<char,_const_char_*> local_88;
  char *local_68;
  Maybe<kj::Array<char>_> *local_60;
  ArrayBuilder<char> local_58;
  
  local_58.endPtr = (char *)0x0;
  local_58.ptr = (char *)0x0;
  local_58.pos = (RemoveConst<char> *)0x0;
  local_60 = __return_storage_ptr__;
  do {
    pAVar1 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).pos;
    pAVar2 = (ArrayDisposer *)(input->super_IteratorInput<char,_const_char_*>).end;
    if (pAVar1 == pAVar2) break;
    local_68 = input->begin;
    local_88.parent = &input->super_IteratorInput<char,_const_char_*>;
    local_88.pos = (char *)pAVar1;
    local_88.end = (char *)pAVar2;
    local_88.best = (char *)pAVar1;
    CharGroup_::operator()((CharGroup_ *)local_8c,(ParserInput *)subParser);
    cVar3 = local_8c[0];
    local_8c[2] = local_8c[0];
    if (local_8c[0] == '\x01') {
      local_8c[3] = local_8c[1];
      ((IteratorInput<char,_const_char_*> *)&(local_88.parent)->parent)->pos = local_88.pos;
      Vector<char>::add<char>((Vector<char> *)&local_58,local_8c + 3);
    }
    IteratorInput<char,_const_char_*>::~IteratorInput
              ((IteratorInput<char,_const_char_*> *)(local_8c + 4));
  } while (cVar3 != '\0');
  Vector<char>::releaseAsArray((Array<char> *)(local_8c + 4),(Vector<char> *)&local_58);
  pMVar4 = local_60;
  (local_60->ptr).isSet = true;
  (local_60->ptr).field_1.value.ptr = (char *)local_88.parent;
  (local_60->ptr).field_1.value.size_ = (size_t)local_88.pos;
  (local_60->ptr).field_1.value.disposer = (ArrayDisposer *)local_88.end;
  local_88.parent = (IteratorInput<char,_const_char_*> *)0x0;
  local_88.pos = (char *)0x0;
  Array<char>::~Array((Array<char> *)(local_8c + 4));
  ArrayBuilder<char>::dispose(&local_58);
  return pMVar4;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }